

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitUnaryNeg(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  AsmJsType *this_00;
  bool bVar1;
  RegSlot R0;
  ParseNode *pnode_00;
  AsmJsCompilationException *this_01;
  ulong uVar2;
  EmitExpressionInfo local_30;
  
  pnode_00 = ParserWrapper::GetUnaryNode(pnode);
  local_30 = Emit(this,pnode_00);
  this_00 = &local_30.type;
  StartStatement(this,pnode);
  bVar1 = AsmJsType::isInt(this_00);
  if (bVar1) {
    bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_30);
    if (bVar1) {
      R0 = GetAndReleaseUnaryLocations<int>(this,&local_30);
      AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Neg_Int,R0,local_30.super_EmitInfoBase.location);
      uVar2 = 0xc00000000;
LAB_00863f02:
      ByteCodeWriter::EndStatement(&(this->mWriter).super_ByteCodeWriter,pnode);
      return (EmitExpressionInfo)(R0 | uVar2);
    }
    this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_01,L"Invalid Node location[%d] ",(ulong)local_30 & 0xffffffff);
  }
  else {
    bVar1 = AsmJsType::isMaybeDouble(this_00);
    if (bVar1) {
      bVar1 = AsmJsFunc::IsValidLocation<double>(this->mFunction,&local_30);
      if (bVar1) {
        R0 = GetAndReleaseUnaryLocations<double>(this,&local_30);
        AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Neg_Db,R0,local_30.super_EmitInfoBase.location);
        uVar2 = 0x200000000;
        goto LAB_00863f02;
      }
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Invalid Node location[%d] ",(ulong)local_30 & 0xffffffff);
    }
    else {
      bVar1 = AsmJsType::isMaybeFloat(this_00);
      if (bVar1) {
        bVar1 = AsmJsFunc::IsValidLocation<float>(this->mFunction,&local_30);
        if (bVar1) {
          R0 = GetAndReleaseUnaryLocations<float>(this,&local_30);
          AsmJsByteCodeWriter::AsmReg2
                    (&this->mWriter,Neg_Flt,R0,local_30.super_EmitInfoBase.location);
          uVar2 = 0x700000000;
          goto LAB_00863f02;
        }
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"Invalid Node location[%d] ",(ulong)local_30 & 0xffffffff);
      }
      else {
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"Type not supported for unary -");
      }
    }
  }
  __cxa_throw(this_01,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitUnaryNeg( ParseNode * pnode )
    {
        ParseNode* rhs = ParserWrapper::GetUnaryNode( pnode );
        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo;
        if( rType.isInt() )
        {
            CheckNodeLocation( rhsEmit, int );
            RegSlot dst = GetAndReleaseUnaryLocations<int>( &rhsEmit );
            emitInfo.type = AsmJsType::Intish;
            mWriter.AsmReg2( OpCodeAsmJs::Neg_Int, dst, rhsEmit.location );
            emitInfo.location = dst;
        }
        else if (rType.isMaybeDouble())
        {
            CheckNodeLocation( rhsEmit, double );
            RegSlot dst = GetAndReleaseUnaryLocations<double>( &rhsEmit );
            emitInfo.type = AsmJsType::Double;
            mWriter.AsmReg2( OpCodeAsmJs::Neg_Db, dst, rhsEmit.location );
            emitInfo.location = dst;
        }
        else if (rType.isMaybeFloat())
        {
            CheckNodeLocation(rhsEmit, float);
            RegSlot dst = GetAndReleaseUnaryLocations<float>(&rhsEmit);
            emitInfo.type = AsmJsType::Floatish;
            mWriter.AsmReg2(OpCodeAsmJs::Neg_Flt, dst, rhsEmit.location);
            emitInfo.location = dst;
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for unary -") );
        }
        EndStatement(pnode);
        return emitInfo;
    }